

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O2

void ncnn::conv3x3s1_winograd63_transform_input_pack4_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  int j;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [16];
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float tmp [8] [8] [4];
  float afStack_438 [4];
  undefined1 auStack_428 [16];
  undefined1 auStack_418 [16];
  undefined1 auStack_408 [16];
  undefined1 auStack_3f8 [16];
  undefined1 auStack_3e8 [16];
  undefined1 auStack_3d8 [16];
  undefined1 auStack_3c8 [16];
  float afStack_3b8 [64];
  undefined1 auStack_2b8 [128];
  undefined1 auStack_238 [128];
  undefined1 auStack_1b8 [128];
  undefined1 auStack_138 [128];
  float afStack_b8 [34];
  
  iVar4 = bottom_blob->w;
  uVar19 = (iVar4 + -2) / 6;
  uVar16 = (long)(bottom_blob->h + -2) / 6;
  iVar15 = (int)uVar16;
  iVar20 = iVar15 * uVar19;
  uVar30 = 0;
  uVar26 = 0;
  if (0 < (int)uVar19) {
    uVar26 = (ulong)uVar19;
  }
  uVar16 = uVar16 & 0xffffffff;
  if (iVar15 < 1) {
    uVar16 = uVar30;
  }
  uVar21 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar21 = uVar30;
  }
  auVar31 = ZEXT1664(CONCAT412(0xc0880000,CONCAT48(0xc0880000,0xc0880000c0880000)));
  auVar37 = ZEXT1664(CONCAT412(0xbfa00000,CONCAT48(0xbfa00000,0xbfa00000bfa00000)));
  for (; uVar30 != uVar21; uVar30 = uVar30 + 1) {
    iVar15 = bottom_blob->w;
    sVar5 = bottom_blob->elemsize;
    lVar25 = bottom_blob_tm->cstep * bottom_blob_tm->elemsize * uVar30;
    pvVar6 = bottom_blob_tm->data;
    lVar29 = (long)bottom_blob->data + bottom_blob->cstep * sVar5 * uVar30 + 0x70;
    lVar18 = 0;
    for (uVar23 = 0; uVar23 != uVar16; uVar23 = uVar23 + 1) {
      lVar17 = lVar18;
      for (uVar24 = 0; uVar24 != uVar26; uVar24 = uVar24 + 1) {
        pauVar22 = (undefined1 (*) [16])(((long)(uVar24 * 0x1800000000) >> 0x1e) + lVar29);
        for (lVar27 = -0x80; lVar27 != 0; lVar27 = lVar27 + 0x10) {
          auVar3 = pauVar22[-6];
          auVar32 = pauVar22[-5];
          auVar36 = pauVar22[-4];
          auVar34 = pauVar22[-3];
          auVar33 = pauVar22[-2];
          auVar35 = pauVar22[-1];
          auVar38 = vsubps_avx(auVar34,auVar32);
          auVar41 = vsubps_avx(pauVar22[-7],auVar35);
          auVar46 = vsubps_avx(auVar36,auVar33);
          auVar51 = vsubps_avx(*pauVar22,auVar3);
          *(float *)((long)afStack_3b8 + lVar27) = auVar41._0_4_ + auVar38._0_4_ * 5.25;
          *(float *)((long)afStack_3b8 + lVar27 + 4) = auVar41._4_4_ + auVar38._4_4_ * 5.25;
          *(float *)((long)afStack_3b8 + lVar27 + 8) = auVar41._8_4_ + auVar38._8_4_ * 5.25;
          *(float *)((long)afStack_3b8 + lVar27 + 0xc) = auVar41._12_4_ + auVar38._12_4_ * 5.25;
          *(float *)((long)afStack_b8 + lVar27 + 0x80) = auVar51._0_4_ + auVar46._0_4_ * 5.25;
          *(float *)((long)afStack_b8 + lVar27 + 0x84) = auVar51._4_4_ + auVar46._4_4_ * 5.25;
          *(float *)(&stack0xffffffffffffffd0 + lVar27) = auVar51._8_4_ + auVar46._8_4_ * 5.25;
          *(float *)(&stack0xffffffffffffffd4 + lVar27) = auVar51._12_4_ + auVar46._12_4_ * 5.25;
          fVar7 = auVar35._0_4_;
          fVar45 = auVar32._0_4_;
          fVar9 = auVar35._4_4_;
          fVar48 = auVar32._4_4_;
          fVar11 = auVar35._8_4_;
          fVar49 = auVar32._8_4_;
          fVar13 = auVar35._12_4_;
          fVar50 = auVar32._12_4_;
          auVar51._0_4_ = auVar34._0_4_ * auVar31._0_4_ + fVar45 + fVar7;
          auVar51._4_4_ = auVar34._4_4_ * auVar31._4_4_ + fVar48 + fVar9;
          auVar51._8_4_ = auVar34._8_4_ * auVar31._8_4_ + fVar49 + fVar11;
          auVar51._12_4_ = auVar34._12_4_ * auVar31._12_4_ + fVar50 + fVar13;
          fVar8 = auVar3._0_4_;
          fVar40 = auVar33._0_4_;
          fVar10 = auVar3._4_4_;
          fVar42 = auVar33._4_4_;
          fVar12 = auVar3._8_4_;
          fVar43 = auVar33._8_4_;
          fVar14 = auVar3._12_4_;
          fVar44 = auVar33._12_4_;
          auVar61._0_4_ = auVar36._0_4_ * auVar31._0_4_ + fVar40 + fVar8;
          auVar61._4_4_ = auVar36._4_4_ * auVar31._4_4_ + fVar42 + fVar10;
          auVar61._8_4_ = auVar36._8_4_ * auVar31._8_4_ + fVar43 + fVar12;
          auVar61._12_4_ = auVar36._12_4_ * auVar31._12_4_ + fVar44 + fVar14;
          auVar3 = vsubps_avx(auVar51,auVar61);
          *(float *)((long)afStack_3b8 + lVar27 + 0x80) = auVar51._0_4_ + auVar61._0_4_;
          *(float *)((long)afStack_3b8 + lVar27 + 0x84) = auVar51._4_4_ + auVar61._4_4_;
          *(float *)((long)afStack_3b8 + lVar27 + 0x88) = auVar51._8_4_ + auVar61._8_4_;
          *(float *)((long)afStack_3b8 + lVar27 + 0x8c) = auVar51._12_4_ + auVar61._12_4_;
          *(undefined1 (*) [16])(auStack_2b8 + lVar27) = auVar3;
          fVar57 = auVar34._0_4_ * auVar37._0_4_;
          fVar58 = auVar34._4_4_ * auVar37._4_4_;
          fVar59 = auVar34._8_4_ * auVar37._8_4_;
          fVar60 = auVar34._12_4_ * auVar37._12_4_;
          auVar52._0_4_ = fVar57 + fVar45 * 0.25 + fVar7;
          auVar52._4_4_ = fVar58 + fVar48 * 0.25 + fVar9;
          auVar52._8_4_ = fVar59 + fVar49 * 0.25 + fVar11;
          auVar52._12_4_ = fVar60 + fVar50 * 0.25 + fVar13;
          fVar53 = auVar36._0_4_ * -2.5;
          fVar54 = auVar36._4_4_ * -2.5;
          fVar55 = auVar36._8_4_ * -2.5;
          fVar56 = auVar36._12_4_ * -2.5;
          auVar62._0_4_ = fVar53 + fVar8 * 0.5 + fVar40 + fVar40;
          auVar62._4_4_ = fVar54 + fVar10 * 0.5 + fVar42 + fVar42;
          auVar62._8_4_ = fVar55 + fVar12 * 0.5 + fVar43 + fVar43;
          auVar62._12_4_ = fVar56 + fVar14 * 0.5 + fVar44 + fVar44;
          auVar63._0_4_ = auVar52._0_4_ + auVar62._0_4_;
          auVar63._4_4_ = auVar52._4_4_ + auVar62._4_4_;
          auVar63._8_4_ = auVar52._8_4_ + auVar62._8_4_;
          auVar63._12_4_ = auVar52._12_4_ + auVar62._12_4_;
          auVar3 = vsubps_avx(auVar52,auVar62);
          *(undefined1 (*) [16])(auStack_238 + lVar27) = auVar63;
          *(undefined1 (*) [16])(auStack_1b8 + lVar27) = auVar3;
          auVar46._0_4_ = (fVar57 + fVar45) * 4.0 + fVar7;
          auVar46._4_4_ = (fVar58 + fVar48) * 4.0 + fVar9;
          auVar46._8_4_ = (fVar59 + fVar49) * 4.0 + fVar11;
          auVar46._12_4_ = (fVar60 + fVar50) * 4.0 + fVar13;
          auVar38._0_4_ = fVar40 * 0.5 + fVar53 + fVar8 + fVar8;
          auVar38._4_4_ = fVar42 * 0.5 + fVar54 + fVar10 + fVar10;
          auVar38._8_4_ = fVar43 * 0.5 + fVar55 + fVar12 + fVar12;
          auVar38._12_4_ = fVar44 * 0.5 + fVar56 + fVar14 + fVar14;
          auVar41._0_4_ = auVar46._0_4_ + auVar38._0_4_;
          auVar41._4_4_ = auVar46._4_4_ + auVar38._4_4_;
          auVar41._8_4_ = auVar46._8_4_ + auVar38._8_4_;
          auVar41._12_4_ = auVar46._12_4_ + auVar38._12_4_;
          auVar3 = vsubps_avx(auVar46,auVar38);
          *(undefined1 (*) [16])(auStack_138 + lVar27) = auVar41;
          *(undefined1 (*) [16])((long)afStack_b8 + lVar27) = auVar3;
          pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(iVar4 << 2) * 4);
        }
        lVar27 = lVar17;
        for (lVar28 = 0; lVar28 != 0x400; lVar28 = lVar28 + 0x80) {
          auVar3 = *(undefined1 (*) [16])(auStack_428 + lVar28);
          auVar32 = *(undefined1 (*) [16])(auStack_418 + lVar28);
          auVar36 = *(undefined1 (*) [16])(auStack_408 + lVar28);
          auVar34 = *(undefined1 (*) [16])(auStack_3f8 + lVar28);
          auVar33 = *(undefined1 (*) [16])(auStack_3e8 + lVar28);
          auVar35 = *(undefined1 (*) [16])(auStack_3d8 + lVar28);
          auVar38 = vsubps_avx(auVar34,auVar32);
          auVar41 = vsubps_avx(*(undefined1 (*) [16])((long)afStack_438 + lVar28),auVar35);
          auVar46 = vsubps_avx(auVar36,auVar33);
          auVar51 = vsubps_avx(*(undefined1 (*) [16])(auStack_3c8 + lVar28),auVar3);
          fVar7 = auVar35._0_4_;
          fVar45 = auVar32._0_4_;
          fVar9 = auVar35._4_4_;
          fVar48 = auVar32._4_4_;
          fVar11 = auVar35._8_4_;
          fVar49 = auVar32._8_4_;
          fVar13 = auVar35._12_4_;
          fVar50 = auVar32._12_4_;
          auVar32._0_4_ = auVar34._0_4_ * auVar31._0_4_ + fVar45 + fVar7;
          auVar32._4_4_ = auVar34._4_4_ * auVar31._4_4_ + fVar48 + fVar9;
          auVar32._8_4_ = auVar34._8_4_ * auVar31._8_4_ + fVar49 + fVar11;
          auVar32._12_4_ = auVar34._12_4_ * auVar31._12_4_ + fVar50 + fVar13;
          fVar8 = auVar3._0_4_;
          fVar40 = auVar33._0_4_;
          fVar10 = auVar3._4_4_;
          fVar42 = auVar33._4_4_;
          fVar12 = auVar3._8_4_;
          fVar43 = auVar33._8_4_;
          fVar14 = auVar3._12_4_;
          fVar44 = auVar33._12_4_;
          auVar33._0_4_ = auVar36._0_4_ * auVar31._0_4_ + fVar40 + fVar8;
          auVar33._4_4_ = auVar36._4_4_ * auVar31._4_4_ + fVar42 + fVar10;
          auVar33._8_4_ = auVar36._8_4_ * auVar31._8_4_ + fVar43 + fVar12;
          auVar33._12_4_ = auVar36._12_4_ * auVar31._12_4_ + fVar44 + fVar14;
          auVar64._0_4_ = auVar32._0_4_ + auVar33._0_4_;
          auVar64._4_4_ = auVar32._4_4_ + auVar33._4_4_;
          auVar64._8_4_ = auVar32._8_4_ + auVar33._8_4_;
          auVar64._12_4_ = auVar32._12_4_ + auVar33._12_4_;
          auVar3 = vsubps_avx(auVar32,auVar33);
          fVar57 = auVar34._0_4_ * auVar37._0_4_;
          fVar58 = auVar34._4_4_ * auVar37._4_4_;
          fVar59 = auVar34._8_4_ * auVar37._8_4_;
          fVar60 = auVar34._12_4_ * auVar37._12_4_;
          auVar34._0_4_ = fVar7 + fVar57 + fVar45 * 0.25;
          auVar34._4_4_ = fVar9 + fVar58 + fVar48 * 0.25;
          auVar34._8_4_ = fVar11 + fVar59 + fVar49 * 0.25;
          auVar34._12_4_ = fVar13 + fVar60 + fVar50 * 0.25;
          fVar53 = auVar36._0_4_ * -2.5;
          fVar54 = auVar36._4_4_ * -2.5;
          fVar55 = auVar36._8_4_ * -2.5;
          fVar56 = auVar36._12_4_ * -2.5;
          auVar35._0_4_ = fVar53 + fVar8 * 0.5 + fVar40 + fVar40;
          auVar35._4_4_ = fVar54 + fVar10 * 0.5 + fVar42 + fVar42;
          auVar35._8_4_ = fVar55 + fVar12 * 0.5 + fVar43 + fVar43;
          auVar35._12_4_ = fVar56 + fVar14 * 0.5 + fVar44 + fVar44;
          auVar32 = vsubps_avx(auVar34,auVar35);
          auVar36._0_4_ = fVar7 + (fVar57 + fVar45) * 4.0;
          auVar36._4_4_ = fVar9 + (fVar58 + fVar48) * 4.0;
          auVar36._8_4_ = fVar11 + (fVar59 + fVar49) * 4.0;
          auVar36._12_4_ = fVar13 + (fVar60 + fVar50) * 4.0;
          auVar39._0_4_ = fVar40 * 0.5 + fVar53 + fVar8 + fVar8;
          auVar39._4_4_ = fVar42 * 0.5 + fVar54 + fVar10 + fVar10;
          auVar39._8_4_ = fVar43 * 0.5 + fVar55 + fVar12 + fVar12;
          auVar39._12_4_ = fVar44 * 0.5 + fVar56 + fVar14 + fVar14;
          auVar47._0_4_ = auVar36._0_4_ + auVar39._0_4_;
          auVar47._4_4_ = auVar36._4_4_ + auVar39._4_4_;
          auVar47._8_4_ = auVar36._8_4_ + auVar39._8_4_;
          auVar47._12_4_ = auVar36._12_4_ + auVar39._12_4_;
          auVar36 = vsubps_avx(auVar36,auVar39);
          puVar1 = (undefined8 *)((long)pvVar6 + lVar27 + lVar25);
          *puVar1 = CONCAT44(auVar41._4_4_ + auVar38._4_4_ * 5.25,
                             auVar41._0_4_ + auVar38._0_4_ * 5.25);
          puVar1[1] = CONCAT44(auVar41._12_4_ + auVar38._12_4_ * 5.25,
                               auVar41._8_4_ + auVar38._8_4_ * 5.25);
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 4) * 4 + lVar25) = auVar64;
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 8) * 4 + lVar25) = auVar3;
          pfVar2 = (float *)((long)pvVar6 + lVar27 + (long)(iVar20 * 0xc) * 4 + lVar25);
          *pfVar2 = auVar34._0_4_ + auVar35._0_4_;
          pfVar2[1] = auVar34._4_4_ + auVar35._4_4_;
          pfVar2[2] = auVar34._8_4_ + auVar35._8_4_;
          pfVar2[3] = auVar34._12_4_ + auVar35._12_4_;
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 0x10) * 4 + lVar25) =
               auVar32;
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 0x14) * 4 + lVar25) =
               auVar47;
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 0x18) * 4 + lVar25) =
               auVar36;
          auVar31 = ZEXT1664(auVar31._0_16_);
          auVar37 = ZEXT1664(auVar37._0_16_);
          auVar3._4_4_ = auVar51._4_4_ + auVar46._4_4_ * 5.25;
          auVar3._0_4_ = auVar51._0_4_ + auVar46._0_4_ * 5.25;
          auVar3._8_4_ = auVar51._8_4_ + auVar46._8_4_ * 5.25;
          auVar3._12_4_ = auVar51._12_4_ + auVar46._12_4_ * 5.25;
          *(undefined1 (*) [16])((long)pvVar6 + lVar27 + (long)(iVar20 * 0x1c) * 4 + lVar25) =
               auVar3;
          lVar27 = lVar27 + (long)(iVar20 * 0x20) * 4;
        }
        lVar17 = lVar17 + 0x10;
      }
      lVar29 = lVar29 + (long)iVar15 * sVar5 * 6;
      lVar18 = lVar18 + (long)(int)uVar19 * 0x10;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack4_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[8][8][4];

        __m128 _v5_25 = _mm_set1_ps(5.25f);
        __m128 _vm4_25 = _mm_set1_ps(-4.25f);
        __m128 _vm1_25 = _mm_set1_ps(-1.25f);
        __m128 _v0_25 = _mm_set1_ps(0.25f);
        __m128 _vm2_5 = _mm_set1_ps(-2.5f);
        __m128 _v0_5 = _mm_set1_ps(0.5f);
        __m128 _v2 = _mm_set1_ps(2.f);
        __m128 _v4 = _mm_set1_ps(4.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 4;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _r00 = _mm_load_ps(r0);
                    __m128 _r01 = _mm_load_ps(r0 + 4);
                    __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r04 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r05 = _mm_load_ps(r0 + 4 * 5);
                    __m128 _r06 = _mm_load_ps(r0 + 4 * 6);
                    __m128 _r07 = _mm_load_ps(r0 + 4 * 7);

                    __m128 _tmp0m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r04, _r02), _mm_sub_ps(_r00, _r06));
                    __m128 _tmp7m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r03, _r05), _mm_sub_ps(_r07, _r01));
                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[7][m], _tmp7m);

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _r04, _mm_add_ps(_r02, _r06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _r03, _mm_add_ps(_r01, _r05));

                    __m128 _tmp1m = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _tmp2m = _mm_sub_ps(_tmp12a, _tmp12b);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _r04, _mm_comp_fmadd_ps(_v0_25, _r02, _r06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v0_5)));

                    __m128 _tmp3m = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _tmp4m = _mm_sub_ps(_tmp34a, _tmp34b);
                    _mm_store_ps(tmp[3][m], _tmp3m);
                    _mm_store_ps(tmp[4][m], _tmp4m);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _r04, _r02), _r06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v2)));

                    __m128 _tmp5m = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _tmp6m = _mm_sub_ps(_tmp56a, _tmp56b);
                    _mm_store_ps(tmp[5][m], _tmp5m);
                    _mm_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 4;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 4;
                float* r0_tm_1 = r0_tm_0 + tiles * 4;
                float* r0_tm_2 = r0_tm_0 + tiles * 4 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 4 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 4 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 4 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 4 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 4 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);
                    __m128 _tmp06 = _mm_load_ps(tmp[m][6]);
                    __m128 _tmp07 = _mm_load_ps(tmp[m][7]);

                    __m128 _r0tm0 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp04, _tmp02), _mm_sub_ps(_tmp00, _tmp06));
                    __m128 _r0tm7 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp03, _tmp05), _mm_sub_ps(_tmp07, _tmp01));

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _tmp04, _mm_add_ps(_tmp02, _tmp06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _tmp03, _mm_add_ps(_tmp01, _tmp05));

                    __m128 _r0tm1 = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _r0tm2 = _mm_sub_ps(_tmp12a, _tmp12b);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _tmp04, _mm_comp_fmadd_ps(_v0_25, _tmp02, _tmp06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v0_5)));

                    __m128 _r0tm3 = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _r0tm4 = _mm_sub_ps(_tmp34a, _tmp34b);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _tmp04, _tmp02), _tmp06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v2)));

                    __m128 _r0tm5 = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _r0tm6 = _mm_sub_ps(_tmp56a, _tmp56b);

                    _mm_store_ps(r0_tm_0, _r0tm0);
                    _mm_store_ps(r0_tm_1, _r0tm1);
                    _mm_store_ps(r0_tm_2, _r0tm2);
                    _mm_store_ps(r0_tm_3, _r0tm3);
                    _mm_store_ps(r0_tm_4, _r0tm4);
                    _mm_store_ps(r0_tm_5, _r0tm5);
                    _mm_store_ps(r0_tm_6, _r0tm6);
                    _mm_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 4 * 8;
                    r0_tm_1 += tiles * 4 * 8;
                    r0_tm_2 += tiles * 4 * 8;
                    r0_tm_3 += tiles * 4 * 8;
                    r0_tm_4 += tiles * 4 * 8;
                    r0_tm_5 += tiles * 4 * 8;
                    r0_tm_6 += tiles * 4 * 8;
                    r0_tm_7 += tiles * 4 * 8;
                }
            }
        }
    }
}